

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O2

int find(int i,int *pp)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    iVar1 = pp[i];
    iVar2 = pp[iVar1];
    if (iVar2 == iVar1) break;
    pp[i] = iVar2;
    i = iVar2;
  }
  return iVar1;
}

Assistant:

static
int find (
	  int i,
	  int *pp
	  )
{
    register int p, gp;
    
    p = pp[i];
    gp = pp[p];
    while (gp != p) {
	pp[i] = gp;
	i = gp;
	p = pp[i];
	gp = pp[p];
    }
    return (p);
}